

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

uint Cudd_ApaIntDivision(int digits,DdApaNumber dividend,uint divisor,DdApaNumber quotient)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)digits;
  if (digits < 1) {
    uVar3 = 0;
  }
  uVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar4 = (double)(uVar1 & 0xffffffff) * 4294967296.0 + (double)dividend[uVar2];
    uVar1 = (ulong)(dVar4 / (double)divisor);
    quotient[uVar2] = (DdApaDigit)uVar1;
    uVar1 = (ulong)(dVar4 - (double)(uVar1 & 0xffffffff) * (double)divisor);
  }
  return (uint)uVar1;
}

Assistant:

unsigned int
Cudd_ApaIntDivision(
  int  digits,
  DdApaNumber dividend,
  unsigned int divisor,
  DdApaNumber quotient)
{
    int i;
    double partial;
    unsigned int remainder = 0;
    double ddiv = (double) divisor;

    for (i = 0; i < digits; i++) {
        partial = (double) remainder * DD_APA_BASE + dividend[i];
        quotient[i] = (DdApaDigit) (partial / ddiv);
        remainder = (unsigned int) (partial - ((double)quotient[i] * ddiv));
    }

    return(remainder);

}